

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
ezc3d::c3d::pointNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,c3d *this)

{
  Parameters *pPVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  Group *pGVar5;
  Parameter *pPVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  long *plVar8;
  ulong uVar9;
  size_type *psVar10;
  uint uVar11;
  uint __val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels;
  string __str;
  string local_a0;
  string local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  long *local_58 [2];
  long local_48 [2];
  c3d *local_38;
  
  pPVar1 = (this->_parameters).
           super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"POINT","");
  pGVar5 = ParametersNS::Parameters::group(pPVar1,&local_80);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"LABELS","");
  pPVar6 = ParametersNS::GroupNS::Group::parameter(pGVar5,&local_a0);
  pvVar7 = ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_(pPVar6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60,pvVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  __val = 2;
  do {
    pPVar1 = (local_38->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"POINT","");
    pGVar5 = ParametersNS::Parameters::group(pPVar1,&local_80);
    uVar11 = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar2 = 4;
      do {
        uVar11 = uVar2;
        uVar4 = (uint)uVar9;
        if (uVar4 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_001220b8;
        }
        if (uVar4 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_001220b8;
        }
        if (uVar4 < 10000) goto LAB_001220b8;
        uVar9 = uVar9 / 10000;
        uVar2 = uVar11 + 4;
      } while (99999 < uVar4);
      uVar11 = uVar11 + 1;
    }
LAB_001220b8:
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar11);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58[0],uVar11,__val);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x13d55b);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_a0.field_2._M_allocated_capacity = *psVar10;
      local_a0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar10;
      local_a0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_a0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    bVar3 = ParametersNS::GroupNS::Group::isParameter(pGVar5,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60;
    }
    pPVar1 = (local_38->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"POINT","");
    pGVar5 = ParametersNS::Parameters::group(pPVar1,&local_80);
    uVar11 = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar2 = 4;
      do {
        uVar11 = uVar2;
        uVar4 = (uint)uVar9;
        if (uVar4 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00122229;
        }
        if (uVar4 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00122229;
        }
        if (uVar4 < 10000) goto LAB_00122229;
        uVar9 = uVar9 / 10000;
        uVar2 = uVar11 + 4;
      } while (99999 < uVar4);
      uVar11 = uVar11 + 1;
    }
LAB_00122229:
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar11);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58[0],uVar11,__val);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x13d55b);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_a0.field_2._M_allocated_capacity = *psVar10;
      local_a0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar10;
      local_a0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_a0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    pPVar6 = ParametersNS::GroupNS::Group::parameter(pGVar5,&local_a0);
    pvVar7 = ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_(pPVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_60,*(undefined8 *)(local_60 + 8),
               (pvVar7->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (pvVar7->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    __val = __val + 1;
  } while( true );
}

Assistant:

const std::vector<std::string> ezc3d::c3d::pointNames() const {
  std::vector<std::string> labels =
      parameters().group("POINT").parameter("LABELS").valuesAsString();
  int i = 2;
  while (
      parameters().group("POINT").isParameter("LABELS" + std::to_string(i))) {
    const std::vector<std::string> &labels_tp =
        parameters()
            .group("POINT")
            .parameter("LABELS" + std::to_string(i))
            .valuesAsString();
    labels.insert(labels.end(), labels_tp.begin(), labels_tp.end());
    ++i;
  }
  return labels;
}